

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O1

int deflateSetDictionary(z_stream *strm,uint8_t *dictionary,uint32_t dictLength)

{
  uint32_t uVar1;
  deflate_state *s;
  uchar *puVar2;
  int iVar3;
  uint32_t uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  
  iVar3 = deflateStateCheck(strm);
  iVar6 = -2;
  if ((dictionary != (uint8_t *)0x0) && (iVar3 == 0)) {
    s = strm->state;
    iVar3 = s->wrap;
    if ((iVar3 != 2) && (((iVar3 != 1 || (s->status == 1)) && (s->lookahead == 0)))) {
      if (iVar3 == 1) {
        uVar4 = adler32_c((uint32_t)strm->adler,dictionary,(ulong)dictLength);
        strm->adler = (ulong)uVar4;
      }
      s->wrap = 0;
      uVar7 = dictLength;
      if (s->w_size <= dictLength) {
        if (iVar3 == 0) {
          memset(s->head,0,0x20000);
          s->strstart = 0;
          s->block_start = 0;
          s->insert = 0;
        }
        uVar7 = s->w_size;
        dictionary = dictionary + (dictLength - uVar7);
      }
      uVar4 = strm->avail_in;
      puVar2 = strm->next_in;
      strm->avail_in = uVar7;
      strm->next_in = dictionary;
      fill_window(s);
      uVar7 = s->lookahead;
      while (2 < uVar7) {
        uVar1 = s->strstart;
        (*s->insert_string)(s,uVar1,uVar7 - 2);
        s->strstart = (uVar1 + uVar7) - 2;
        s->lookahead = 2;
        fill_window(s);
        uVar7 = s->lookahead;
      }
      uVar5 = s->strstart + uVar7;
      s->strstart = uVar5;
      s->block_start = uVar5;
      s->insert = uVar7;
      iVar6 = 0;
      s->lookahead = 0;
      s->prev_length = 0;
      s->match_available = 0;
      strm->next_in = puVar2;
      strm->avail_in = uVar4;
      s->wrap = iVar3;
    }
  }
  return iVar6;
}

Assistant:

int32_t Z_EXPORT PREFIX(deflateSetDictionary)(PREFIX3(stream) *strm, const uint8_t *dictionary, uint32_t dictLength) {
    deflate_state *s;
    unsigned int str, n;
    int wrap;
    uint32_t avail;
    const unsigned char *next;

    if (deflateStateCheck(strm) || dictionary == NULL)
        return Z_STREAM_ERROR;
    s = strm->state;
    wrap = s->wrap;
    if (wrap == 2 || (wrap == 1 && s->status != INIT_STATE) || s->lookahead)
        return Z_STREAM_ERROR;

    /* when using zlib wrappers, compute Adler-32 for provided dictionary */
    if (wrap == 1)
        strm->adler = FUNCTABLE_CALL(adler32)(strm->adler, dictionary, dictLength);
    DEFLATE_SET_DICTIONARY_HOOK(strm, dictionary, dictLength);  /* hook for IBM Z DFLTCC */
    s->wrap = 0;                    /* avoid computing Adler-32 in read_buf */

    /* if dictionary would fill window, just replace the history */
    if (dictLength >= s->w_size) {
        if (wrap == 0) {            /* already empty otherwise */
            CLEAR_HASH(s);
            s->strstart = 0;
            s->block_start = 0;
            s->insert = 0;
        }
        dictionary += dictLength - s->w_size;  /* use the tail */
        dictLength = s->w_size;
    }

    /* insert dictionary into window and hash */
    avail = strm->avail_in;
    next = strm->next_in;
    strm->avail_in = dictLength;
    strm->next_in = (z_const unsigned char *)dictionary;
    PREFIX(fill_window)(s);
    while (s->lookahead >= STD_MIN_MATCH) {
        str = s->strstart;
        n = s->lookahead - (STD_MIN_MATCH - 1);
        s->insert_string(s, str, n);
        s->strstart = str + n;
        s->lookahead = STD_MIN_MATCH - 1;
        PREFIX(fill_window)(s);
    }
    s->strstart += s->lookahead;
    s->block_start = (int)s->strstart;
    s->insert = s->lookahead;
    s->lookahead = 0;
    s->prev_length = 0;
    s->match_available = 0;
    strm->next_in = (z_const unsigned char *)next;
    strm->avail_in = avail;
    s->wrap = wrap;
    return Z_OK;
}